

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_compute_forward_mul_mat
               (ggml_compute_params *params,ggml_tensor *src0,ggml_tensor *src1,ggml_tensor *dst)

{
  undefined4 *in_RSI;
  ggml_tensor *in_stack_000000f8;
  ggml_tensor *in_stack_00000100;
  ggml_tensor *in_stack_00000108;
  ggml_compute_params *in_stack_00000110;
  ggml_tensor *in_stack_00000158;
  ggml_tensor *in_stack_00000160;
  ggml_tensor *in_stack_00000168;
  ggml_tensor *in_stack_00000170;
  ggml_tensor *in_stack_00000178;
  ggml_compute_params *in_stack_00000180;
  
  switch(*in_RSI) {
  case 0:
    ggml_compute_forward_mul_mat_q4_0_f32
              ((ggml_compute_params *)in_stack_00000170,in_stack_00000168,in_stack_00000160,
               in_stack_00000158);
    break;
  case 1:
    ggml_compute_forward_mul_mat_q4_1_f32
              ((ggml_compute_params *)in_stack_00000170,in_stack_00000168,in_stack_00000160,
               in_stack_00000158);
    break;
  case 2:
  case 3:
  case 4:
  case 7:
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x1a4a,
            "false");
    abort();
  case 5:
    ggml_compute_forward_mul_mat_f16_f32
              (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
    break;
  case 6:
    ggml_compute_forward_mul_mat_f32
              (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8);
  }
  return;
}

Assistant:

static void ggml_compute_forward_mul_mat(
        const struct ggml_compute_params * params,
        const struct ggml_tensor * src0,
        const struct ggml_tensor * src1,
        struct ggml_tensor * dst) {
    switch (src0->type) {
        case GGML_TYPE_Q4_0:
            {
                ggml_compute_forward_mul_mat_q4_0_f32(params, src0, src1, dst);
            } break;
        case GGML_TYPE_Q4_1:
            {
                ggml_compute_forward_mul_mat_q4_1_f32(params, src0, src1, dst);
            } break;
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_mul_mat_f16_f32(params, src0, src1, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_mul_mat_f32(params, src0, src1, dst);
            } break;
        case GGML_TYPE_I8:
        case GGML_TYPE_I16:
        case GGML_TYPE_I32:
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }

#if 0
    if (src0->type == GGML_TYPE_F16 || src0->type == GGML_TYPE_Q4_1) {
        static int first = 8;
        printf("src0: ne0 = %5d, ne1 = %5d, ne2 = %5d\n", src0->ne[0], src0->ne[1], src0->ne[2]);
        printf("src1: ne0 = %5d, ne1 = %5d, ne2 = %5d\n", src1->ne[0], src1->ne[1], src1->ne[2]);
        printf("dst:  ne0 = %5d, ne1 = %5d, ne2 = %5d\n", dst->ne[0], dst->ne[1], dst->ne[2]);
        if (first) {
            --first;
        } else {
            for (int k = 0; k < dst->ne[1]; ++k) {
                for (int j = 0; j < dst->ne[0]/16; ++j) {
                    for (int i = 0; i < 16; ++i) {
                        printf("%8.4f ", ((float *) dst->data)[k*dst->ne[0] + j*16 + i]);
                    }
                    printf("\n");
                }
                printf("\n");
            }
            printf("\n");
            exit(0);
        }
    } else {
        printf("aaaa src0: ne0 = %5d, ne1 = %5d, ne2 = %5d\n", src0->ne[0], src0->ne[1], src0->ne[2]);
        printf("aaaa src1: ne0 = %5d, ne1 = %5d, ne2 = %5d\n", src1->ne[0], src1->ne[1], src1->ne[2]);
        printf("aaaa dst:  ne0 = %5d, ne1 = %5d, ne2 = %5d\n", dst->ne[0], dst->ne[1], dst->ne[2]);
    }
#endif
}